

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboMultisampleTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::FboMultisampleTests::init(FboMultisampleTests *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  deUint32 dVar2;
  TestContext *testCtx;
  Context *pCVar3;
  int extraout_EAX;
  TestNode *node;
  long *plVar4;
  FboTestCase *pFVar5;
  char *pcVar6;
  long *plVar7;
  long lVar8;
  long lVar9;
  long *local_1e8;
  long local_1d8;
  long lStack_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  lVar9 = 0;
  do {
    iVar1 = init::sampleCounts[lVar9];
    node = (TestNode *)operator_new(0x70);
    testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::ostream::operator<<(local_1a8,iVar1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    plVar4 = (long *)std::__cxx11::string::append((char *)local_1c8);
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_1d8 = *plVar7;
      lStack_1d0 = plVar4[3];
      local_1e8 = &local_1d8;
    }
    else {
      local_1d8 = *plVar7;
      local_1e8 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,testCtx,(char *)local_1e8,
               glcts::fixed_sample_locations_values + 1);
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8 + 1);
    }
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0],local_1b8[0] + 1);
    }
    tcu::TestNode::addChild((TestNode *)this,node);
    lVar8 = 0;
    do {
      pFVar5 = (FboTestCase *)operator_new(0xa0);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      dVar2 = *(deUint32 *)((long)init::colorFormats + lVar8);
      pcVar6 = FboTestUtil::getFormatName(dVar2);
      FboTestCase::FboTestCase(pFVar5,pCVar3,pcVar6,glcts::fixed_sample_locations_values + 1,false);
      (pFVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__FboTestCase_02149990;
      *(deUint32 *)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = dVar2;
      *(undefined8 *)
       ((long)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
           0x7700000000;
      *(undefined4 *)((long)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
           0x83;
      *(int *)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           iVar1;
      tcu::TestNode::addChild(node,(TestNode *)pFVar5);
      lVar8 = lVar8 + 4;
    } while (lVar8 != 0x40);
    lVar8 = 0;
    do {
      pFVar5 = (FboTestCase *)operator_new(0xa0);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      dVar2 = *(deUint32 *)((long)init::depthStencilFormats + lVar8);
      pcVar6 = FboTestUtil::getFormatName(dVar2);
      FboTestCase::FboTestCase(pFVar5,pCVar3,pcVar6,glcts::fixed_sample_locations_values + 1,false);
      (pFVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__FboTestCase_02149990;
      *(undefined4 *)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x8058
      ;
      *(deUint32 *)
       ((long)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = dVar2;
      pFVar5[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x8300000077
      ;
      *(int *)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           iVar1;
      tcu::TestNode::addChild(node,(TestNode *)pFVar5);
      lVar8 = lVar8 + 4;
    } while (lVar8 != 0x18);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  return extraout_EAX;
}

Assistant:

void FboMultisampleTests::init (void)
{
	static const deUint32 colorFormats[] =
	{
		// RGBA formats
		GL_RGBA8,
		GL_SRGB8_ALPHA8,
		GL_RGB10_A2,
		GL_RGBA4,
		GL_RGB5_A1,

		// RGB formats
		GL_RGB8,
		GL_RGB565,

		// RG formats
		GL_RG8,

		// R formats
		GL_R8,

		// GL_EXT_color_buffer_float
		GL_RGBA32F,
		GL_RGBA16F,
		GL_R11F_G11F_B10F,
		GL_RG32F,
		GL_RG16F,
		GL_R32F,
		GL_R16F
	};

	static const deUint32 depthStencilFormats[] =
	{
		GL_DEPTH_COMPONENT32F,
		GL_DEPTH_COMPONENT24,
		GL_DEPTH_COMPONENT16,
		GL_DEPTH32F_STENCIL8,
		GL_DEPTH24_STENCIL8,
		GL_STENCIL_INDEX8
	};

	static const int sampleCounts[] = { 2, 4, 8 };

	for (int sampleCntNdx = 0; sampleCntNdx < DE_LENGTH_OF_ARRAY(sampleCounts); sampleCntNdx++)
	{
		int					samples				= sampleCounts[sampleCntNdx];
		tcu::TestCaseGroup*	sampleCountGroup	= new tcu::TestCaseGroup(m_testCtx, (de::toString(samples) + "_samples").c_str(), "");
		addChild(sampleCountGroup);

		// Color formats.
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); fmtNdx++)
			sampleCountGroup->addChild(new BasicFboMultisampleCase(m_context, getFormatName(colorFormats[fmtNdx]), "", colorFormats[fmtNdx], GL_NONE, IVec2(119, 131), samples));

		// Depth/stencil formats.
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(depthStencilFormats); fmtNdx++)
			sampleCountGroup->addChild(new BasicFboMultisampleCase(m_context, getFormatName(depthStencilFormats[fmtNdx]), "", GL_RGBA8, depthStencilFormats[fmtNdx], IVec2(119, 131), samples));
	}
}